

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryDecoder.cc
# Opt level: O2

bool __thiscall avro::BinaryDecoder::decodeBool(BinaryDecoder *this)

{
  ssize_t sVar1;
  Exception *this_00;
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  allocator<char> local_39;
  string local_38;
  
  sVar1 = StreamReader::read(&this->in_,in_ESI,in_RDX,in_RCX);
  if ((byte)sVar1 < 2) {
    return (byte)sVar1 != 0;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Invalid value for bool",&local_39);
  Exception::Exception(this_00,&local_38);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

bool BinaryDecoder::decodeBool()
{
    uint8_t v = in_.read();
    if (v == 0) {
        return false;
    } else if (v == 1) {
        return true;
    }
    throw Exception("Invalid value for bool");
}